

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O3

mcu8str * mctools_absolute_path(mcu8str *__return_storage_ptr__,mcu8str *pathraw)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  mcu8str path;
  mcu8str local_48;
  mcu8str local_30;
  
  pcVar1 = pathraw->c_str;
  uVar3 = pathraw->size;
  local_48.buflen = uVar3 + 1;
  local_48.owns_memory = 0;
  local_48.c_str = pcVar1;
  local_48.size = uVar3;
  iVar2 = mctools_impl_has_winnamespace(pathraw);
  if (iVar2 != 0) {
    local_48.c_str = pcVar1 + 4;
    uVar3 = uVar3 - 4;
    local_48.size = uVar3;
  }
  __return_storage_ptr__->c_str = mcu8str_create_empty::dummy;
  __return_storage_ptr__->size = 0;
  __return_storage_ptr__->buflen = 0;
  __return_storage_ptr__->owns_memory = 0;
  if (uVar3 != 0) {
    iVar2 = mctools_path_is_absolute(&local_48);
    if (iVar2 == 0) {
      mctools_get_current_working_dir();
      mctools_path_join(__return_storage_ptr__,&local_30,&local_48);
      if ((local_30.owns_memory != 0) && (local_30.c_str != (char *)0x0)) {
        free(local_30.c_str);
      }
    }
    else {
      mcu8str_copy(__return_storage_ptr__,&local_48);
    }
    mctools_pathseps_platform(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

mcu8str mctools_absolute_path( const mcu8str* pathraw )
  {
    mcu8str path = mctools_impl_view_no_winnamespace(pathraw);
    mcu8str res = mcu8str_create_empty();
    if ( path.size == 0 )
      return res;
#ifdef MC_IS_WINDOWS
    {
      mcwinstr wpath = mc_path2wpath( &path );
      res = mc_winstr_expand_to_fullpath_u8str( &wpath );
      mc_winstr_dealloc(&wpath);
    }
    const int not_done = (res.size == 0?1:0);
#else
    const int not_done = 1;
#endif
    if ( not_done ) {
      if ( mctools_path_is_absolute(&path) ) {
        res = mcu8str_copy( &path );
      } else {
        mcu8str cwd = mctools_get_current_working_dir();
        res = mctools_path_join( &cwd, &path );
        mcu8str_dealloc(&cwd);
      }
    }
    mctools_pathseps_platform(&res);
    return res;
  }